

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O0

void __thiscall QDeviceDiscoveryUDev::handleUDevNotification(QDeviceDiscoveryUDev *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  QDeviceDiscovery *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QLatin1StringView QVar8;
  QLatin1StringView QVar9;
  udev_device *parent_dev;
  char *subsystem;
  char *action;
  udev_device *dev;
  char *str;
  QString devNode;
  QString *in_stack_ffffffffffffff58;
  char **in_stack_ffffffffffffff68;
  QByteArrayView *in_stack_ffffffffffffff70;
  char *local_70;
  storage_type *local_50;
  undefined1 local_40 [24];
  long local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char16_t **)&in_RDI[1].field_0x8 == (char16_t *)0x0) goto LAB_00114452;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x114230);
  lVar3 = udev_monitor_receive_device(*(char16_t **)&in_RDI[1].field_0x8);
  if ((lVar3 != 0) && (pcVar4 = (char *)udev_device_get_action(lVar3), pcVar4 != (char *)0x0)) {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_28 = udev_device_get_devnode(lVar3);
    if (local_28 != 0) {
      QByteArrayView::QByteArrayView<const_char_*,_true>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QVar7.m_data = local_50;
      QVar7.m_size = (qsizetype)local_40;
      QString::fromUtf8(QVar7);
      QString::operator=((QString *)in_RDI,in_stack_ffffffffffffff58);
      QString::~QString((QString *)0x114300);
      QVar8 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_ffffffffffffff68,(size_t)in_RDI);
      uVar5 = QString::startsWith((QLatin1String *)&local_20,(CaseSensitivity)QVar8.m_size);
      if ((uVar5 & 1) == 0) {
        QVar9 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_ffffffffffffff68,(size_t)in_RDI);
        uVar5 = QString::startsWith((QLatin1String *)&local_20,(CaseSensitivity)QVar9.m_size);
        if ((uVar5 & 1) == 0) goto LAB_0011443b;
        local_70 = "drm";
      }
      else {
        local_70 = "input";
      }
      bVar1 = checkDeviceType((QDeviceDiscoveryUDev *)QVar8.m_data,(udev_device *)QVar8.m_size);
      if ((bVar1) ||
         ((lVar6 = udev_device_get_parent_with_subsystem_devtype(lVar3,local_70,0), lVar6 != 0 &&
          (bVar1 = checkDeviceType((QDeviceDiscoveryUDev *)QVar8.m_data,(udev_device *)QVar8.m_size)
          , bVar1)))) {
        iVar2 = qstrcmp(pcVar4,"add");
        if (iVar2 == 0) {
          QDeviceDiscovery::deviceDetected(in_RDI,in_stack_ffffffffffffff58);
        }
        iVar2 = qstrcmp(pcVar4,"remove");
        if (iVar2 == 0) {
          QDeviceDiscovery::deviceRemoved(in_RDI,in_stack_ffffffffffffff58);
        }
      }
    }
  }
LAB_0011443b:
  udev_device_unref(lVar3);
  QString::~QString((QString *)0x114452);
LAB_00114452:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDeviceDiscoveryUDev::handleUDevNotification()
{
    if (!m_udevMonitor)
        return;

    struct udev_device *dev;
    QString devNode;

    dev = udev_monitor_receive_device(m_udevMonitor);
    if (!dev)
        goto cleanup;

    const char *action;
    action = udev_device_get_action(dev);
    if (!action)
        goto cleanup;

    const char *str;
    str = udev_device_get_devnode(dev);
    if (!str)
        goto cleanup;

    const char *subsystem;
    devNode = QString::fromUtf8(str);
    if (devNode.startsWith(QT_EVDEV_DEVICE ""_L1))
        subsystem = "input";
    else if (devNode.startsWith(QT_DRM_DEVICE ""_L1))
        subsystem = "drm";
    else goto cleanup;

    // if we cannot determine a type, walk up the device tree
    if (!checkDeviceType(dev)) {
        // does not increase the refcount
        struct udev_device *parent_dev = udev_device_get_parent_with_subsystem_devtype(dev, subsystem, 0);
        if (!parent_dev)
            goto cleanup;

        if (!checkDeviceType(parent_dev))
            goto cleanup;
    }

    if (qstrcmp(action, "add") == 0)
        emit deviceDetected(devNode);

    if (qstrcmp(action, "remove") == 0)
        emit deviceRemoved(devNode);

cleanup:
    udev_device_unref(dev);
}